

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::initEmpty(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
            *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *(undefined8 *)(this + 8) = 0;
  auVar3 = _DAT_001c5050;
  auVar2 = _DAT_001c5040;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    if ((ulong)uVar1 != 0) {
      uVar5 = (ulong)uVar1 + 0xfffffffffffffff;
      uVar6 = uVar5 & 0xfffffffffffffff;
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      puVar4 = (undefined8 *)(*(long *)this + 0x10);
      lVar7 = 0;
      auVar8 = auVar8 ^ _DAT_001c5050;
      do {
        auVar9._8_4_ = (int)lVar7;
        auVar9._0_8_ = lVar7;
        auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          puVar4[-2] = 0;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          *puVar4 = 0;
        }
        lVar7 = lVar7 + 2;
        puVar4 = puVar4 + 4;
      } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x158,
                "void llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::initEmpty() [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }